

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall
FfsParser::parseCpdExtensionsArea(FfsParser *this,UModelIndex *index,UINT32 localOffset)

{
  int iVar1;
  TreeModel *pTVar2;
  ulong uVar3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  bool bVar6;
  USTATUS UVar7;
  uint uVar8;
  char *pcVar9;
  uint pos;
  ulong uVar10;
  UByteArray data;
  UModelIndex local_3e0;
  UByteArray header;
  _func_int **local_380;
  uint64_t uStack_378;
  TreeModel *local_370;
  UModelIndex extIndex;
  uint local_350;
  CBString local_338;
  UByteArray partition;
  CBString info;
  CBString name;
  UByteArray body;
  CBString local_258;
  CBString local_240;
  CBString local_228;
  CBString local_210;
  CBString local_1f8;
  CBString local_1e0;
  CBString local_1c8;
  CBString local_1b0;
  CBString local_198;
  CBString local_180;
  CBString local_168;
  CBString local_150;
  CBString local_138;
  CBString local_120;
  CBString local_108;
  CBString local_f0;
  CBString local_d8;
  CBString local_c0;
  CBString local_a8;
  CBString local_90;
  CBString local_78;
  CBString local_60;
  CBString local_48;
  
  bVar6 = UModelIndex::isValid(index);
  if (bVar6) {
    TreeModel::body(&body,this->model,index);
    uVar10 = 0;
    while( true ) {
      _Var5._M_p = body.d._M_dataplus._M_p;
      pos = (uint)uVar10;
      if (((uint)body.d._M_string_length <= pos) ||
         ((uint)body.d._M_string_length - pos <= *(int *)(body.d._M_dataplus._M_p + uVar10 + 4) - 1U
         )) break;
      UByteArray::mid(&partition,&body,pos,*(int *)(body.d._M_dataplus._M_p + uVar10 + 4));
      cpdExtensionTypeToUstring(&name,*(UINT32 *)(_Var5._M_p + uVar10));
      usprintf(&info,"Full size: %Xh (%u)\nType: %Xh",(ulong)(uint)partition.d._M_string_length);
      _Var4 = partition.d._M_dataplus;
      extIndex.r = -1;
      extIndex.c = -1;
      extIndex.i = 0;
      extIndex.m = (TreeModel *)0x0;
      iVar1 = *(int *)(_Var5._M_p + uVar10);
      if (iVar1 == 10) {
        UByteArray::UByteArray
                  (&header,partition.d._M_dataplus._M_p + 0x18,
                   (uint)partition.d._M_string_length - 0x18);
        std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  (header.d._M_dataplus._M_p,header.d._M_dataplus._M_p + header.d._M_string_length);
        usprintf((CBString *)&local_380,
                 "Full size: %Xh (%u)\nType: %Xh\nCompression type: %Xh\nUncompressed size: %Xh (%u)\nCompressed size: %Xh (%u)\nGlobal module ID: %Xh\nImage hash: "
                 ,(ulong)(uint)partition.d._M_string_length,
                 (ulong)(uint)partition.d._M_string_length,(ulong)*(uint *)_Var4._M_p,
                 (ulong)*(uint *)(_Var4._M_p + 8),(ulong)*(uint *)(_Var4._M_p + 0xc),
                 (ulong)*(uint *)(_Var4._M_p + 0xc),(ulong)*(uint *)(_Var4._M_p + 0x10),
                 (ulong)*(uint *)(_Var4._M_p + 0x10),(ulong)*(uint *)(_Var4._M_p + 0x14));
        UByteArray::toHex(&data,&header);
        Bstrlib::CBString::CBString(&local_338,data.d._M_dataplus._M_p);
        Bstrlib::CBString::operator+((CBString *)&local_3e0,(CBString *)&local_380,&local_338);
        Bstrlib::CBString::operator=(&info,(CBString *)&local_3e0);
        Bstrlib::CBString::~CBString((CBString *)&local_3e0);
        Bstrlib::CBString::~CBString(&local_338);
        std::__cxx11::string::~string((string *)&data);
        Bstrlib::CBString::~CBString((CBString *)&local_380);
        pTVar2 = this->model;
        Bstrlib::CBString::CBString(&local_338);
        data.d._M_dataplus._M_p = (pointer)&data.d.field_2;
        data.d._M_string_length = 0;
        data.d.field_2._M_local_buf[0] = '\0';
        local_3e0._0_8_ = &local_3e0.m;
        local_3e0.i = 0;
        local_3e0.m._0_1_ = 0;
        TreeModel::addItem((UModelIndex *)&local_380,pTVar2,pos + localOffset,'b','\0',&name,
                           &local_338,&info,&data,&partition,(UByteArray *)&local_3e0,Fixed,index,
                           '\0');
        extIndex.m = local_370;
        extIndex._0_8_ = local_380;
        extIndex.i = uStack_378;
        std::__cxx11::string::~string((string *)&local_3e0);
        std::__cxx11::string::~string((string *)&data);
        Bstrlib::CBString::~CBString(&local_338);
        std::__cxx11::string::~string((string *)&header);
      }
      else if (iVar1 == 0x16) {
        local_350 = (uint)(*(ulong *)(partition.d._M_dataplus._M_p + 0x1c) >> 0x20);
        uVar8 = local_350 >> 8;
        if (0x30 < *(ulong *)(partition.d._M_dataplus._M_p + 0x1c) >> 0x28) {
          uVar8 = 0x30;
        }
        UByteArray::UByteArray(&header,partition.d._M_dataplus._M_p + 0x24,uVar8);
        std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  (header.d._M_dataplus._M_p,header.d._M_dataplus._M_p + header.d._M_string_length);
        uVar3 = *(ulong *)(_Var4._M_p + 0x1c);
        usprintf(&local_258,
                 "Full size: %Xh (%u)\nType: %Xh\nPartition name: %.4s\nPartition length: %Xh\nPartition version major: %Xh\nPartition version minor: %Xh\nData format version: %Xh\nInstance ID: %Xh\nHash algorithm: %Xh\nHash size: %Xh\nAction on update: %Xh"
                 ,(ulong)(uint)partition.d._M_string_length,
                 (ulong)(uint)partition.d._M_string_length,(ulong)*(uint *)_Var4._M_p,_Var4._M_p + 8
                 ,(ulong)*(uint *)(_Var4._M_p + 0xc),(ulong)*(ushort *)(_Var4._M_p + 0x12),
                 (ulong)*(ushort *)(_Var4._M_p + 0x10),(ulong)*(uint *)(_Var4._M_p + 0x14),
                 (ulong)*(uint *)(_Var4._M_p + 0x18),uVar3 >> 0x20 & 0xff,uVar3 >> 0x28,
                 (ulong)((uint)(uVar3 >> 2) & 3));
        Bstrlib::CBString::CBString(&local_108,"\nSupport multiple instances: ");
        Bstrlib::CBString::operator+(&local_f0,&local_258,&local_108);
        pcVar9 = "Yes";
        if ((_Var4._M_p[0x1c] & 1U) == 0) {
          pcVar9 = "No";
        }
        Bstrlib::CBString::operator+(&local_240,&local_f0,pcVar9);
        Bstrlib::CBString::CBString(&local_120,"\nSupport API version based update: ");
        Bstrlib::CBString::operator+(&local_d8,&local_240,&local_120);
        pcVar9 = "Yes";
        if ((_Var4._M_p[0x1c] & 2U) == 0) {
          pcVar9 = "No";
        }
        Bstrlib::CBString::operator+(&local_228,&local_d8,pcVar9);
        Bstrlib::CBString::CBString(&local_138,"\nObey full update rules: ");
        Bstrlib::CBString::operator+(&local_c0,&local_228,&local_138);
        pcVar9 = "Yes";
        if ((_Var4._M_p[0x1c] & 0x10U) == 0) {
          pcVar9 = "No";
        }
        Bstrlib::CBString::operator+(&local_210,&local_c0,pcVar9);
        Bstrlib::CBString::CBString(&local_150,"\nIFR enable only: ");
        Bstrlib::CBString::operator+(&local_a8,&local_210,&local_150);
        pcVar9 = "Yes";
        if ((_Var4._M_p[0x1c] & 0x20U) == 0) {
          pcVar9 = "No";
        }
        Bstrlib::CBString::operator+(&local_1f8,&local_a8,pcVar9);
        Bstrlib::CBString::CBString(&local_168,"\nAllow cross point update: ");
        Bstrlib::CBString::operator+(&local_90,&local_1f8,&local_168);
        pcVar9 = "Yes";
        if ((_Var4._M_p[0x1c] & 0x40U) == 0) {
          pcVar9 = "No";
        }
        Bstrlib::CBString::operator+(&local_1e0,&local_90,pcVar9);
        Bstrlib::CBString::CBString(&local_180,"\nAllow cross hotfix update: ");
        Bstrlib::CBString::operator+(&local_78,&local_1e0,&local_180);
        pcVar9 = "Yes";
        if (-1 < _Var4._M_p[0x1c]) {
          pcVar9 = "No";
        }
        Bstrlib::CBString::operator+(&local_1c8,&local_78,pcVar9);
        Bstrlib::CBString::CBString(&local_60,"\nPartial update only: ");
        Bstrlib::CBString::operator+(&local_48,&local_1c8,&local_60);
        pcVar9 = "Yes";
        if ((*(uint *)(_Var4._M_p + 0x1c) >> 8 & 1) == 0) {
          pcVar9 = "No";
        }
        Bstrlib::CBString::operator+(&local_338,&local_48,pcVar9);
        Bstrlib::CBString::CBString(&local_198,"\nPartition hash: ");
        Bstrlib::CBString::operator+((CBString *)&local_380,&local_338,&local_198);
        UByteArray::toHex(&data,&header);
        Bstrlib::CBString::CBString(&local_1b0,data.d._M_dataplus._M_p);
        Bstrlib::CBString::operator+((CBString *)&local_3e0,(CBString *)&local_380,&local_1b0);
        Bstrlib::CBString::operator=(&info,(CBString *)&local_3e0);
        Bstrlib::CBString::~CBString((CBString *)&local_3e0);
        Bstrlib::CBString::~CBString(&local_1b0);
        std::__cxx11::string::~string((string *)&data);
        Bstrlib::CBString::~CBString((CBString *)&local_380);
        Bstrlib::CBString::~CBString(&local_198);
        Bstrlib::CBString::~CBString(&local_338);
        Bstrlib::CBString::~CBString(&local_48);
        Bstrlib::CBString::~CBString(&local_60);
        Bstrlib::CBString::~CBString(&local_1c8);
        Bstrlib::CBString::~CBString(&local_78);
        Bstrlib::CBString::~CBString(&local_180);
        Bstrlib::CBString::~CBString(&local_1e0);
        Bstrlib::CBString::~CBString(&local_90);
        Bstrlib::CBString::~CBString(&local_168);
        Bstrlib::CBString::~CBString(&local_1f8);
        Bstrlib::CBString::~CBString(&local_a8);
        Bstrlib::CBString::~CBString(&local_150);
        Bstrlib::CBString::~CBString(&local_210);
        Bstrlib::CBString::~CBString(&local_c0);
        Bstrlib::CBString::~CBString(&local_138);
        Bstrlib::CBString::~CBString(&local_228);
        Bstrlib::CBString::~CBString(&local_d8);
        Bstrlib::CBString::~CBString(&local_120);
        Bstrlib::CBString::~CBString(&local_240);
        Bstrlib::CBString::~CBString(&local_f0);
        Bstrlib::CBString::~CBString(&local_108);
        Bstrlib::CBString::~CBString(&local_258);
        pTVar2 = this->model;
        Bstrlib::CBString::CBString(&local_338);
        data.d._M_dataplus._M_p = (pointer)&data.d.field_2;
        data.d._M_string_length = 0;
        data.d.field_2._M_local_buf[0] = '\0';
        local_3e0._0_8_ = &local_3e0.m;
        local_3e0.i = 0;
        local_3e0.m._0_1_ = 0;
        TreeModel::addItem((UModelIndex *)&local_380,pTVar2,pos + localOffset,'b','\0',&name,
                           &local_338,&info,&data,&partition,(UByteArray *)&local_3e0,Fixed,index,
                           '\0');
        extIndex.m = local_370;
        extIndex._0_8_ = local_380;
        extIndex.i = uStack_378;
        std::__cxx11::string::~string((string *)&local_3e0);
        std::__cxx11::string::~string((string *)&data);
        Bstrlib::CBString::~CBString(&local_338);
        local_350 = local_350 >> 8;
        if (0x30 < local_350) {
          usprintf((CBString *)&data,
                   "%s: IFWI Partition Manifest hash size is %u, maximum allowed is %u, truncated",
                   "parseCpdExtensionsArea",*(ulong *)(_Var4._M_p + 0x1c) >> 0x28,0x30);
          msg(this,(CBString *)&data,&extIndex);
          Bstrlib::CBString::~CBString((CBString *)&data);
        }
        std::__cxx11::string::~string((string *)&header);
      }
      else if (iVar1 == 0xf) {
        UByteArray::left(&header,&partition,0x34);
        UByteArray::mid(&data,&partition,(int32_t)header.d._M_string_length,-1);
        usprintf((CBString *)&local_3e0,
                 "Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nType: %Xh\nPackage name: %.4s\nVersion control number: %Xh\nSecurity version number: %Xh\nUsage bitmap: %02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X"
                 ,(ulong)(uint)partition.d._M_string_length,
                 (ulong)(uint)partition.d._M_string_length,header.d._M_string_length & 0xffffffff,
                 header.d._M_string_length & 0xffffffff,(ulong)(uint)body.d._M_string_length,
                 (ulong)(uint)body.d._M_string_length,(ulong)*(uint *)header.d._M_dataplus._M_p,
                 header.d._M_dataplus._M_p + 8,(ulong)*(uint *)(header.d._M_dataplus._M_p + 0xc),
                 (ulong)*(uint *)(header.d._M_dataplus._M_p + 0x20),
                 (ulong)(byte)header.d._M_dataplus._M_p[0x10],
                 (ulong)(byte)header.d._M_dataplus._M_p[0x11],
                 (ulong)(byte)header.d._M_dataplus._M_p[0x12],
                 (ulong)(byte)header.d._M_dataplus._M_p[0x13],
                 (ulong)(byte)header.d._M_dataplus._M_p[0x14],
                 (ulong)(byte)header.d._M_dataplus._M_p[0x15],
                 (ulong)(byte)header.d._M_dataplus._M_p[0x16],
                 (ulong)(byte)header.d._M_dataplus._M_p[0x17],
                 (ulong)(byte)header.d._M_dataplus._M_p[0x18],
                 (ulong)(byte)header.d._M_dataplus._M_p[0x19],
                 (ulong)(byte)header.d._M_dataplus._M_p[0x1a],
                 (ulong)(byte)header.d._M_dataplus._M_p[0x1b],
                 (ulong)(byte)header.d._M_dataplus._M_p[0x1c],
                 (ulong)(byte)header.d._M_dataplus._M_p[0x1d],
                 (ulong)(byte)header.d._M_dataplus._M_p[0x1e],
                 (ulong)(byte)header.d._M_dataplus._M_p[0x1f]);
        Bstrlib::CBString::operator=(&info,(CBString *)&local_3e0);
        Bstrlib::CBString::~CBString((CBString *)&local_3e0);
        pTVar2 = this->model;
        Bstrlib::CBString::CBString(&local_338);
        local_3e0._0_8_ = &local_3e0.m;
        local_3e0.i = 0;
        local_3e0.m._0_1_ = 0;
        TreeModel::addItem((UModelIndex *)&local_380,pTVar2,pos + localOffset,'b','\0',&name,
                           &local_338,&info,&header,&data,(UByteArray *)&local_3e0,Fixed,index,'\0')
        ;
        extIndex.m = local_370;
        extIndex._0_8_ = local_380;
        extIndex.i = uStack_378;
        std::__cxx11::string::~string((string *)&local_3e0);
        Bstrlib::CBString::~CBString(&local_338);
        parseSignedPackageInfoData(this,&extIndex);
        std::__cxx11::string::~string((string *)&data);
        std::__cxx11::string::~string((string *)&header);
      }
      else {
        pTVar2 = this->model;
        Bstrlib::CBString::CBString((CBString *)&local_380);
        header.d._M_dataplus._M_p = (pointer)&header.d.field_2;
        header.d._M_string_length = 0;
        header.d.field_2._M_local_buf[0] = '\0';
        data.d._M_dataplus._M_p = (pointer)&data.d.field_2;
        data.d._M_string_length = 0;
        data.d.field_2._M_local_buf[0] = '\0';
        TreeModel::addItem(&local_3e0,pTVar2,pos + localOffset,'b','\0',&name,(CBString *)&local_380
                           ,&info,&header,&partition,&data,Fixed,index,'\0');
        extIndex.m = (TreeModel *)CONCAT71(local_3e0.m._1_7_,local_3e0.m._0_1_);
        extIndex.r = local_3e0.r;
        extIndex.c = local_3e0.c;
        extIndex.i = local_3e0.i;
        std::__cxx11::string::~string((string *)&data);
        std::__cxx11::string::~string((string *)&header);
        Bstrlib::CBString::~CBString((CBString *)&local_380);
      }
      uVar8 = *(uint *)(_Var5._M_p + uVar10);
      if ((0x1a < uVar8) &&
         ((0x32 < uVar8 || ((0x4000cc0000000U >> ((ulong)uVar8 & 0x3f) & 1) == 0)))) {
        usprintf((CBString *)&header,"%s: CPD extension of unknown type found",
                 "parseCpdExtensionsArea");
        msg(this,(CBString *)&header,&extIndex);
        Bstrlib::CBString::~CBString((CBString *)&header);
      }
      uVar10 = (ulong)(pos + *(int *)(_Var5._M_p + uVar10 + 4));
      Bstrlib::CBString::~CBString(&info);
      Bstrlib::CBString::~CBString(&name);
      std::__cxx11::string::~string((string *)&partition);
    }
    std::__cxx11::string::~string((string *)&body);
    UVar7 = 0;
  }
  else {
    UVar7 = 1;
  }
  return UVar7;
}

Assistant:

USTATUS FfsParser::parseCpdExtensionsArea(const UModelIndex & index, const UINT32 localOffset)
{
    if (!index.isValid()) {
        return U_INVALID_PARAMETER;
    }
    
    UByteArray body = model->body(index);
    UINT32 offset = 0;
    while (offset < (UINT32)body.size()) {
        const CPD_EXTENTION_HEADER* extHeader = (const CPD_EXTENTION_HEADER*) (body.constData() + offset);
        if (extHeader->Length > 0
            && extHeader->Length <= ((UINT32)body.size() - offset)) {
            UByteArray partition = body.mid(offset, extHeader->Length);
            
            UString name = cpdExtensionTypeToUstring(extHeader->Type);
            UString info = usprintf("Full size: %Xh (%u)\nType: %Xh", (UINT32)partition.size(), (UINT32)partition.size(), extHeader->Type);
            
            // Parse Signed Package Info a bit further
            UModelIndex extIndex;
            if (extHeader->Type == CPD_EXT_TYPE_SIGNED_PACKAGE_INFO) {
                UByteArray header = partition.left(sizeof(CPD_EXT_SIGNED_PACKAGE_INFO));
                UByteArray data = partition.mid(header.size());
                
                const CPD_EXT_SIGNED_PACKAGE_INFO* infoHeader = (const CPD_EXT_SIGNED_PACKAGE_INFO*)header.constData();
                
                info = usprintf("Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nType: %Xh\n"
                                "Package name: %.4s\nVersion control number: %Xh\nSecurity version number: %Xh\n"
                                "Usage bitmap: %02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X",
                                (UINT32)partition.size(), (UINT32)partition.size(),
                                (UINT32)header.size(), (UINT32)header.size(),
                                (UINT32)body.size(), (UINT32)body.size(),
                                infoHeader->ExtensionType,
                                infoHeader->PackageName,
                                infoHeader->Vcn,
                                infoHeader->Svn,
                                infoHeader->UsageBitmap[0],  infoHeader->UsageBitmap[1],  infoHeader->UsageBitmap[2],  infoHeader->UsageBitmap[3],
                                infoHeader->UsageBitmap[4],  infoHeader->UsageBitmap[5],  infoHeader->UsageBitmap[6],  infoHeader->UsageBitmap[7],
                                infoHeader->UsageBitmap[8],  infoHeader->UsageBitmap[9],  infoHeader->UsageBitmap[10], infoHeader->UsageBitmap[11],
                                infoHeader->UsageBitmap[12], infoHeader->UsageBitmap[13], infoHeader->UsageBitmap[14], infoHeader->UsageBitmap[15]);
                
                // Add tree item
                extIndex = model->addItem(offset + localOffset, Types::CpdExtension, 0, name, UString(), info, header, data, UByteArray(), Fixed, index);
                parseSignedPackageInfoData(extIndex);
            }
            // Parse IFWI Partition Manifest a bit further
            else if (extHeader->Type == CPD_EXT_TYPE_IFWI_PARTITION_MANIFEST) {
                const CPD_EXT_IFWI_PARTITION_MANIFEST* attrHeader = (const CPD_EXT_IFWI_PARTITION_MANIFEST*)partition.constData();
                
                // Check HashSize to be sane.
                UINT32 hashSize = attrHeader->HashSize;
                bool msgHashSizeMismatch = false;
                if (hashSize > sizeof(attrHeader->CompletePartitionHash)) {
                    hashSize = sizeof(attrHeader->CompletePartitionHash);
                    msgHashSizeMismatch = true;
                }
                
                // This hash is stored reversed
                // Need to reverse it back to normal
                UByteArray hash((const char*)&attrHeader->CompletePartitionHash, hashSize);
                std::reverse(hash.begin(), hash.end());
                
                info = usprintf("Full size: %Xh (%u)\nType: %Xh\n"
                                "Partition name: %.4s\nPartition length: %Xh\nPartition version major: %Xh\nPartition version minor: %Xh\n"
                                "Data format version: %Xh\nInstance ID: %Xh\nHash algorithm: %Xh\nHash size: %Xh\nAction on update: %Xh",
                                (UINT32)partition.size(), (UINT32)partition.size(),
                                attrHeader->ExtensionType,
                                attrHeader->PartitionName,
                                attrHeader->CompletePartitionLength,
                                attrHeader->PartitionVersionMajor, attrHeader->PartitionVersionMinor,
                                attrHeader->DataFormatVersion,
                                attrHeader->InstanceId,
                                attrHeader->HashAlgorithm,
                                attrHeader->HashSize,
                                attrHeader->ActionOnUpdate)
                + UString("\nSupport multiple instances: ") + (attrHeader->SupportMultipleInstances ? "Yes" : "No")
                + UString("\nSupport API version based update: ") + (attrHeader->SupportApiVersionBasedUpdate ? "Yes" : "No")
                + UString("\nObey full update rules: ") + (attrHeader->ObeyFullUpdateRules ? "Yes" : "No")
                + UString("\nIFR enable only: ") + (attrHeader->IfrEnableOnly ? "Yes" : "No")
                + UString("\nAllow cross point update: ") + (attrHeader->AllowCrossPointUpdate ? "Yes" : "No")
                + UString("\nAllow cross hotfix update: ") + (attrHeader->AllowCrossHotfixUpdate ? "Yes" : "No")
                + UString("\nPartial update only: ") + (attrHeader->PartialUpdateOnly ? "Yes" : "No")
                + UString("\nPartition hash: ") +  UString(hash.toHex().constData());
                
                // Add tree item
                extIndex = model->addItem(offset + localOffset, Types::CpdExtension, 0, name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, index);
                if (msgHashSizeMismatch) {
                    msg(usprintf("%s: IFWI Partition Manifest hash size is %u, maximum allowed is %u, truncated", __FUNCTION__, attrHeader->HashSize, (UINT32)sizeof(attrHeader->CompletePartitionHash)), extIndex);
                }
            }
            // Parse Module Attributes a bit further
            else if (extHeader->Type == CPD_EXT_TYPE_MODULE_ATTRIBUTES) {
                const CPD_EXT_MODULE_ATTRIBUTES* attrHeader = (const CPD_EXT_MODULE_ATTRIBUTES*)partition.constData();
                int hashSize = (UINT32)partition.size() - CpdExtModuleImageHashOffset;
                
                // This hash is stored reversed
                // Need to reverse it back to normal
                UByteArray hash((const char*)attrHeader + CpdExtModuleImageHashOffset, hashSize);
                std::reverse(hash.begin(), hash.end());
                
                info = usprintf("Full size: %Xh (%u)\nType: %Xh\n"
                                "Compression type: %Xh\nUncompressed size: %Xh (%u)\nCompressed size: %Xh (%u)\nGlobal module ID: %Xh\nImage hash: ",
                                (UINT32)partition.size(), (UINT32)partition.size(),
                                attrHeader->ExtensionType,
                                attrHeader->CompressionType,
                                attrHeader->UncompressedSize, attrHeader->UncompressedSize,
                                attrHeader->CompressedSize, attrHeader->CompressedSize,
                                attrHeader->GlobalModuleId) + UString(hash.toHex().constData());
                
                // Add tree item
                extIndex = model->addItem(offset + localOffset, Types::CpdExtension, 0, name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, index);
            }
            // Parse everything else
            else {
                // Add tree item, if needed
                extIndex = model->addItem(offset + localOffset, Types::CpdExtension, 0, name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, index);
            }
            
            // There needs to be a more generic way to do it, but it is fine for now
            if (extHeader->Type > CPD_EXT_TYPE_TBT_METADATA
                && extHeader->Type != CPD_EXT_TYPE_GMF_CERTIFICATE
                && extHeader->Type != CPD_EXT_TYPE_GMF_BODY
                && extHeader->Type != CPD_EXT_TYPE_KEY_MANIFEST_EXT
                && extHeader->Type != CPD_EXT_TYPE_SIGNED_PACKAGE_INFO_EXT
                && extHeader->Type != CPD_EXT_TYPE_SPS_PLATFORM_ID) {
                msg(usprintf("%s: CPD extension of unknown type found", __FUNCTION__), extIndex);
            }
            
            offset += extHeader->Length;
        }
        else break;
        // TODO: add padding at the end
    }
    
    return U_SUCCESS;
}